

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-reader.h
# Opt level: O0

CountExpr __thiscall
mp::internal::
NLReader<mp::internal::TextReader<fmt::Locale>,_mp::internal::VarBoundHandler<TestNLHandler3>_>::
ReadCountExpr(NLReader<mp::internal::TextReader<fmt::Locale>,_mp::internal::VarBoundHandler<TestNLHandler3>_>
              *this)

{
  int iVar1;
  CountExpr CVar2;
  long in_RDI;
  NLReader<mp::internal::TextReader<fmt::Locale>,_mp::internal::VarBoundHandler<TestNLHandler3>_>
  *unaff_retaddr;
  CountArgHandler args;
  int num_args;
  undefined4 in_stack_fffffffffffffff0;
  long lVar3;
  int num_args_00;
  
  lVar3 = in_RDI;
  iVar1 = ReadNumArgs(unaff_retaddr,(int)((ulong)in_RDI >> 0x20));
  num_args_00 = (int)((ulong)lVar3 >> 0x20);
  NLHandler<mp::NullNLHandler<int>,_int>::BeginCount
            ((NLHandler<mp::NullNLHandler<int>,_int> *)CONCAT44(iVar1,in_stack_fffffffffffffff0),
             (int)((ulong)in_RDI >> 0x20));
  NLReader<mp::internal::TextReader<fmt::Locale>,mp::internal::VarBoundHandler<TestNLHandler3>>::
  ReadArgs<mp::internal::NLReader<mp::internal::TextReader<fmt::Locale>,mp::internal::VarBoundHandler<TestNLHandler3>>::LogicalExprReader,mp::NLHandler<mp::NullNLHandler<int>,int>::ArgHandler>
            (unaff_retaddr,num_args_00,(ArgHandler *)CONCAT44(iVar1,in_stack_fffffffffffffff0));
  CVar2 = NLHandler<mp::NullNLHandler<int>,_int>::EndCount
                    (*(NLHandler<mp::NullNLHandler<int>,_int> **)(in_RDI + 0x10));
  return CVar2;
}

Assistant:

typename Handler::CountExpr ReadCountExpr() {
    int num_args = ReadNumArgs(1);
    typename Handler::CountArgHandler args = handler_.BeginCount(num_args);
    ReadArgs<LogicalExprReader>(num_args, args);
    return handler_.EndCount(args);
  }